

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minihttp.cpp
# Opt level: O2

POST * __thiscall minihttp::POST::add(POST *this,char *key,char *value)

{
  allocator<char> local_39;
  string local_38;
  
  if ((this->data)._M_string_length != 0) {
    std::__cxx11::string::push_back((char)this);
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,key,&local_39);
  URLEncode(&local_38,&this->data);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::push_back((char)this);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,value,&local_39);
  URLEncode(&local_38,&this->data);
  std::__cxx11::string::~string((string *)&local_38);
  return this;
}

Assistant:

POST& POST::add(const char *key, const char *value)
{
    if(!empty())
        data += '&';
    URLEncode(key, data);
    data += '=';
    URLEncode(value, data);
    return *this;
}